

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O2

void __thiscall
tcu::TestPackageRegistry::registerPackage
          (TestPackageRegistry *this,char *name,TestPackageCreateFunc createFunc)

{
  PackageInfo *this_00;
  allocator<char> local_51;
  string local_50 [32];
  PackageInfo *local_30;
  
  this_00 = (PackageInfo *)operator_new(0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,name,&local_51);
  std::__cxx11::string::string((string *)this_00,local_50);
  this_00->createFunc = createFunc;
  local_30 = this_00;
  std::
  vector<tcu::TestPackageRegistry::PackageInfo*,std::allocator<tcu::TestPackageRegistry::PackageInfo*>>
  ::emplace_back<tcu::TestPackageRegistry::PackageInfo*>
            ((vector<tcu::TestPackageRegistry::PackageInfo*,std::allocator<tcu::TestPackageRegistry::PackageInfo*>>
              *)this,&local_30);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void TestPackageRegistry::registerPackage (const char* name, TestPackageCreateFunc createFunc)
{
	DE_ASSERT(getPackageInfoByName(name) == DE_NULL);
	m_packageInfos.push_back(new PackageInfo(name, createFunc));
}